

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::~Texture3DFilteringCase
          (Texture3DFilteringCase *this)

{
  pointer pFVar1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture3DFilteringCase_00d21d98;
  deinit(this);
  pFVar1 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1,(long)(this->m_cases).
                                 super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar1);
  }
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&this->m_renderer);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

Texture3DFilteringCase::~Texture3DFilteringCase (void)
{
	Texture3DFilteringCase::deinit();
}